

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

int detect_transition_to_still
              (FIRSTPASS_INFO *firstpass_info,int next_stats_index,int min_gf_interval,
              int frame_interval,int still_interval,double loop_decay_rate,double last_decay_rate)

{
  int iVar1;
  FIRSTPASS_STATS *pFVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar3 = 0;
  if ((((min_gf_interval < frame_interval) && (0.999 <= loop_decay_rate)) && (last_decay_rate < 0.9)
      ) && (iVar1 = av1_firstpass_info_future_count(firstpass_info,next_stats_index), uVar3 = 0,
           still_interval <= iVar1)) {
    iVar5 = 0;
    iVar1 = 0;
    if (0 < still_interval) {
      iVar1 = still_interval;
    }
    while ((iVar4 = iVar1, iVar1 != iVar5 &&
           (pFVar2 = av1_firstpass_info_peek(firstpass_info,next_stats_index + iVar5), iVar4 = iVar5
           , 0.999 <= pFVar2->pcnt_inter - pFVar2->pcnt_motion))) {
      iVar5 = iVar5 + 1;
    }
    uVar3 = (uint)(iVar4 == still_interval);
  }
  return uVar3;
}

Assistant:

static int detect_transition_to_still(const FIRSTPASS_INFO *firstpass_info,
                                      int next_stats_index,
                                      const int min_gf_interval,
                                      const int frame_interval,
                                      const int still_interval,
                                      const double loop_decay_rate,
                                      const double last_decay_rate) {
  // Break clause to detect very still sections after motion
  // For example a static image after a fade or other transition
  // instead of a clean scene cut.
  if (frame_interval > min_gf_interval && loop_decay_rate >= 0.999 &&
      last_decay_rate < 0.9) {
    int stats_left =
        av1_firstpass_info_future_count(firstpass_info, next_stats_index);
    if (stats_left >= still_interval) {
      int j;
      // Look ahead a few frames to see if static condition persists...
      for (j = 0; j < still_interval; ++j) {
        const FIRSTPASS_STATS *stats =
            av1_firstpass_info_peek(firstpass_info, next_stats_index + j);
        if (stats->pcnt_inter - stats->pcnt_motion < 0.999) break;
      }
      // Only if it does do we signal a transition to still.
      return j == still_interval;
    }
  }
  return 0;
}